

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yang_print_parsed_body(lys_ypr_ctx *pctx,lysp_module *modp)

{
  byte *pbVar1;
  ly_out *out;
  lysp_deviate *plVar2;
  long lVar3;
  uint16_t uVar4;
  lysp_module *plVar5;
  ushort uVar6;
  uint uVar7;
  lysp_ext *plVar8;
  lysp_ext_instance *plVar9;
  lysp_ext_instance *plVar10;
  lysp_feature *plVar11;
  lysp_ident *plVar12;
  char **ppcVar13;
  lysp_tpdf *plVar14;
  lysp_deviation *plVar15;
  char *pcVar16;
  ulong uVar17;
  lysp_ext_instance *plVar18;
  uint16_t *puVar19;
  char *pcVar20;
  long lVar21;
  lysc_ext *plVar22;
  ulong uVar23;
  lysp_ext_instance *plVar24;
  lysp_node_grp *grp;
  lysp_node *node;
  lysp_node_augment *aug;
  lysp_node_action *action;
  lysp_node_notif *notif;
  lysp_deviate *plVar25;
  ly_bool flag;
  ly_bool local_4b;
  ly_bool local_4a;
  ly_bool local_49;
  lysp_module *local_48;
  ly_bool local_39;
  lysp_ext_instance *local_38;
  
  plVar8 = modp->extensions;
  local_48 = modp;
  if (plVar8 != (lysp_ext *)0x0) {
    plVar22 = (lysc_ext *)0x0;
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (plVar8[-1].compiled <= plVar22) {
        (pctx->field_0).field_0.flags = uVar6 | 1;
        break;
      }
      uVar7 = (pctx->field_0).field_0.options;
      if (((uVar6 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar6 & 0xfffe, (uVar7 & 2) == 0))
      {
        ly_print_((pctx->field_0).field_0.out,"\n");
        uVar7 = (pctx->field_0).field_0.options;
      }
      plVar8 = local_48->extensions + (long)plVar22;
      uVar23 = 0;
      local_4b = '\0';
      local_4a = '\0';
      if ((uVar7 & 2) == 0) {
        uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*sextension %s",uVar23,"",plVar8->name);
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 + 1;
      yprp_extension_instances(pctx,LY_STMT_EXTENSION,'\0',plVar8->exts,&local_4b);
      if (plVar8->argname != (char *)0x0) {
        if (local_4b == '\0') {
          local_4b = '\x01';
          ly_print_((pctx->field_0).field_0.out," {\n");
        }
        uVar23 = 0;
        if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
            (undefined1  [24])0x0) {
          uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
        }
        ly_print_((pctx->field_0).field_0.out,"%*sargument %s",uVar23,"");
        puVar19 = &(pctx->field_0).field_0.level;
        *puVar19 = *puVar19 + 1;
        plVar10 = plVar8->exts;
        if (plVar10 == (lysp_ext_instance *)0x0) {
          if ((plVar8->flags & 0x180) == 0) goto LAB_0018ae5c;
          plVar10 = (lysp_ext_instance *)0x0;
LAB_0018ae12:
          if (local_4a == '\0') {
            local_4a = '\x01';
            ly_print_((pctx->field_0).field_0.out," {\n");
            plVar10 = plVar8->exts;
          }
          pcVar20 = "true";
          if (-1 < (char)plVar8->flags) {
            pcVar20 = "false";
          }
          ypr_substmt(pctx,LY_STMT_YIN_ELEMENT,'\0',pcVar20,'\0',plVar10);
        }
        else {
          plVar24 = (lysp_ext_instance *)0xffffffffffffffff;
          while( true ) {
            plVar24 = (lysp_ext_instance *)
                      lysp_ext_instance_iter
                                (plVar10,(uint64_t)((long)&plVar24->name + 1),LY_STMT_ARGUMENT);
            plVar10 = plVar8->exts;
            if (plVar10 == (lysp_ext_instance *)0x0) {
              plVar9 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar9 = plVar10[-1].exts;
            }
            if (plVar24 == plVar9) break;
            yprp_extension_instance(pctx,LY_STMT_ARGUMENT,'\0',plVar10 + (long)plVar24,&local_4a);
            plVar10 = plVar8->exts;
          }
          if ((plVar8->flags & 0x180) != 0) goto LAB_0018ae12;
          if (plVar10 != (lysp_ext_instance *)0x0) {
            plVar9 = (lysp_ext_instance *)lysp_ext_instance_iter(plVar10,0,LY_STMT_YIN_ELEMENT);
            plVar10 = plVar8->exts;
            plVar24 = (lysp_ext_instance *)0x0;
            if (plVar10 != (lysp_ext_instance *)0x0) {
              plVar24 = plVar10[-1].exts;
            }
            if (plVar9 != plVar24) goto LAB_0018ae12;
          }
        }
LAB_0018ae5c:
        puVar19 = &(pctx->field_0).field_0.level;
        *puVar19 = *puVar19 - 1;
        ypr_close(pctx,local_4a);
      }
      ypr_status(pctx,plVar8->flags,plVar8->exts,&local_4b);
      ypr_description(pctx,plVar8->dsc,plVar8->exts,&local_4b);
      ypr_reference(pctx,plVar8->ref,plVar8->exts,&local_4b);
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 - 1;
      ypr_close(pctx,local_4b);
      plVar22 = (lysc_ext *)((long)&plVar22->name + 1);
      plVar8 = local_48->extensions;
    } while (plVar8 != (lysp_ext *)0x0);
  }
  plVar10 = local_48->exts;
  puVar19 = &plVar10->flags;
  plVar24 = (lysp_ext_instance *)0xffffffffffffffff;
  do {
    if (plVar10 == (lysp_ext_instance *)0x0) {
      plVar9 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar9 = plVar10[-1].exts;
    }
    plVar24 = (lysp_ext_instance *)((long)&plVar24->name + 1);
    if (plVar9 <= plVar24) goto LAB_0018af5e;
    uVar4 = *puVar19;
    puVar19 = puVar19 + 0x38;
  } while ((uVar4 & 0x1000) != 0);
  uVar6 = (pctx->field_0).field_0.flags;
  if (((uVar6 & 1) != 0) &&
     ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
     (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
     (undefined1  [24])0x0)) {
    ly_print_((pctx->field_0).field_0.out,"\n");
  }
  plVar5 = local_48;
  yprp_extension_instances(pctx,LY_STMT_MODULE,'\0',local_48->exts,(ly_bool *)0x0);
  plVar10 = plVar5->exts;
LAB_0018af5e:
  if (plVar10 != (lysp_ext_instance *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  plVar11 = local_48->features;
  if (plVar11 != (lysp_feature *)0x0) {
    uVar23 = 0xffffffffffffffff;
    lVar21 = 0x38;
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      uVar23 = uVar23 + 1;
      if (*(ulong *)&plVar11[-1].flags <= uVar23) {
        (pctx->field_0).field_0.flags = uVar6 | 1;
        break;
      }
      uVar7 = (pctx->field_0).field_0.options;
      if (((uVar6 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar6 & 0xfffe, (uVar7 & 2) == 0))
      {
        ly_print_((pctx->field_0).field_0.out,"\n");
        uVar7 = (pctx->field_0).field_0.options;
      }
      plVar11 = local_48->features;
      local_39 = '\0';
      uVar17 = 0;
      if ((uVar7 & 2) == 0) {
        uVar17 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*sfeature %s",uVar17,"",
                *(undefined8 *)((long)plVar11 + lVar21 + -0x38));
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 + 1;
      yprp_extension_instances
                (pctx,LY_STMT_FEATURE,'\0',*(lysp_ext_instance **)((long)plVar11 + lVar21 + -8),
                 &local_39);
      yprp_iffeatures(pctx,*(lysp_qname **)((long)plVar11 + lVar21 + -0x30),
                      *(lysp_ext_instance **)((long)plVar11 + lVar21 + -8),&local_39);
      ypr_status(pctx,*(uint16_t *)((long)&plVar11->name + lVar21),
                 *(void **)((long)plVar11 + lVar21 + -8),&local_39);
      ypr_description(pctx,*(char **)((long)plVar11 + lVar21 + -0x18),
                      *(void **)((long)plVar11 + lVar21 + -8),&local_39);
      ypr_reference(pctx,*(char **)((long)plVar11 + lVar21 + -0x10),
                    *(void **)((long)plVar11 + lVar21 + -8),&local_39);
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 - 1;
      ypr_close(pctx,local_39);
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
      plVar11 = local_48->features;
      lVar21 = lVar21 + 0x40;
    } while (plVar11 != (lysp_feature *)0x0);
  }
  plVar12 = local_48->identities;
  if (plVar12 != (lysp_ident *)0x0) {
    uVar23 = 0;
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (*(ulong *)&plVar12[-1].flags <= uVar23) {
        (pctx->field_0).field_0.flags = uVar6 | 1;
        break;
      }
      uVar7 = (pctx->field_0).field_0.options;
      if (((uVar6 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar6 & 0xfffe, (uVar7 & 2) == 0))
      {
        ly_print_((pctx->field_0).field_0.out,"\n");
        uVar7 = (pctx->field_0).field_0.options;
      }
      plVar12 = local_48->identities + uVar23;
      local_49 = '\0';
      uVar17 = 0;
      if ((uVar7 & 2) == 0) {
        uVar17 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*sidentity %s",uVar17,"",plVar12->name);
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 + 1;
      yprp_extension_instances(pctx,LY_STMT_IDENTITY,'\0',plVar12->exts,&local_49);
      yprp_iffeatures(pctx,plVar12->iffeatures,plVar12->exts,&local_49);
      pcVar20 = (char *)0x0;
      while( true ) {
        ppcVar13 = plVar12->bases;
        if (ppcVar13 == (char **)0x0) {
          pcVar16 = (char *)0x0;
        }
        else {
          pcVar16 = ppcVar13[-1];
        }
        if (pcVar16 <= pcVar20) break;
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out," {\n");
          ppcVar13 = plVar12->bases;
        }
        ypr_substmt(pctx,LY_STMT_BASE,(uint8_t)pcVar20,ppcVar13[(long)pcVar20],'\0',plVar12->exts);
        pcVar20 = pcVar20 + 1;
      }
      ypr_status(pctx,plVar12->flags,plVar12->exts,&local_49);
      ypr_description(pctx,plVar12->dsc,plVar12->exts,&local_49);
      ypr_reference(pctx,plVar12->ref,plVar12->exts,&local_49);
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 - 1;
      ypr_close(pctx,local_49);
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
      uVar23 = uVar23 + 1;
      plVar12 = local_48->identities;
    } while (plVar12 != (lysp_ident *)0x0);
  }
  plVar5 = local_48;
  plVar14 = local_48->typedefs;
  if (plVar14 != (lysp_tpdf *)0x0) {
    uVar23 = 0xffffffffffffffff;
    lVar21 = 0;
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      uVar23 = uVar23 + 1;
      if (*(ulong *)&plVar14[-1].flags <= uVar23) {
        (pctx->field_0).field_0.flags = uVar6 | 1;
        break;
      }
      if (((uVar6 & 1) != 0) &&
         ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
         (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
         (undefined1  [24])0x0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      yprp_typedef(pctx,(lysp_tpdf *)((long)&plVar5->typedefs->name + lVar21));
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
      plVar14 = plVar5->typedefs;
      lVar21 = lVar21 + 0xb0;
    } while (plVar14 != (lysp_tpdf *)0x0);
  }
  grp = local_48->groupings;
  if (grp != (lysp_node_grp *)0x0) {
    uVar6 = (pctx->field_0).field_0.flags;
    do {
      if (((uVar6 & 1) != 0) &&
         ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
         (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
         (undefined1  [24])0x0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      yprp_grouping(pctx,grp);
      uVar6 = (pctx->field_0).field_0.flags | 1;
      (pctx->field_0).field_0.flags = uVar6;
      grp = (grp->field_0).field_1.next;
    } while (grp != (lysp_node_grp *)0x0);
    if (local_48->groupings != (lysp_node_grp *)0x0) {
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  node = local_48->data;
  if (node != (lysp_node *)0x0) {
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (((uVar6 & 1) != 0) &&
         ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
         (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
         (undefined1  [24])0x0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      yprp_node(pctx,node);
      node = node->next;
    } while (node != (lysp_node *)0x0);
    if (local_48->data != (lysp_node *)0x0) {
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  aug = local_48->augments;
  if (aug != (lysp_node_augment *)0x0) {
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (((uVar6 & 1) != 0) &&
         ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
         (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
         (undefined1  [24])0x0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      yprp_augment(pctx,aug);
      aug = (aug->field_0).field_1.next;
    } while (aug != (lysp_node_augment *)0x0);
    if (local_48->augments != (lysp_node_augment *)0x0) {
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  action = local_48->rpcs;
  if (action != (lysp_node_action *)0x0) {
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (((uVar6 & 1) != 0) &&
         ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
         (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
         (undefined1  [24])0x0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      yprp_action(pctx,action);
      action = (action->field_0).field_1.next;
    } while (action != (lysp_node_action *)0x0);
    if (local_48->rpcs != (lysp_node_action *)0x0) {
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  notif = local_48->notifs;
  if (notif != (lysp_node_notif *)0x0) {
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (((uVar6 & 1) != 0) &&
         ((pctx->field_0).field_0.flags = uVar6 & 0xfffe,
         (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
         (undefined1  [24])0x0)) {
        ly_print_((pctx->field_0).field_0.out,"\n");
      }
      yprp_notification(pctx,notif);
      notif = (notif->field_0).field_1.next;
    } while (notif != (lysp_node_notif *)0x0);
    if (local_48->notifs != (lysp_node_notif *)0x0) {
      pbVar1 = (byte *)((long)&pctx->field_0 + 10);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  plVar15 = local_48->deviations;
  if (plVar15 != (lysp_deviation *)0x0) {
    plVar10 = (lysp_ext_instance *)0x0;
    do {
      uVar6 = (pctx->field_0).field_0.flags;
      if (plVar15[-1].exts <= plVar10) {
        (pctx->field_0).field_0.flags = uVar6 | 1;
        return;
      }
      uVar7 = (pctx->field_0).field_0.options;
      if (((uVar6 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar6 & 0xfffe, (uVar7 & 2) == 0))
      {
        ly_print_((pctx->field_0).field_0.out,"\n");
        uVar7 = (pctx->field_0).field_0.options;
      }
      plVar15 = local_48->deviations;
      uVar23 = 0;
      if ((uVar7 & 2) == 0) {
        uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      local_38 = plVar10;
      ly_print_((pctx->field_0).field_0.out,"%*sdeviation \"%s\" {\n",uVar23,"");
      puVar19 = &(pctx->field_0).field_0.level;
      *puVar19 = *puVar19 + 1;
      yprp_extension_instances
                (pctx,LY_STMT_DEVIATION,'\0',plVar15[(long)plVar10].exts,(ly_bool *)0x0);
      if (plVar15[(long)plVar10].dsc != (char *)0x0) {
        ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',plVar15[(long)plVar10].dsc,'\0',
                    plVar15[(long)plVar10].exts);
      }
      if (plVar15[(long)plVar10].ref != (char *)0x0) {
        ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',plVar15[(long)plVar10].ref,'\0',
                    plVar15[(long)plVar10].exts);
      }
      for (plVar25 = plVar15[(long)plVar10].deviates; plVar25 != (lysp_deviate *)0x0;
          plVar25 = plVar25->next) {
        uVar23 = 0;
        if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
            (undefined1  [24])0x0) {
          uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
        }
        ly_print_((pctx->field_0).field_0.out,"%*sdeviate ",uVar23,"");
        switch(plVar25->mod) {
        case '\x01':
          out = (pctx->field_0).field_0.out;
          if (plVar25->exts != (lysp_ext_instance *)0x0) {
            ly_print_(out,"not-supported {\n");
            puVar19 = &(pctx->field_0).field_0.level;
            *puVar19 = *puVar19 + 1;
            yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar25->exts,(ly_bool *)0x0);
            break;
          }
          ly_print_(out,"not-supported;\n");
          goto LAB_0018b9a2;
        case '\x02':
          ly_print_((pctx->field_0).field_0.out,"add {\n");
          puVar19 = &(pctx->field_0).field_0.level;
          *puVar19 = *puVar19 + 1;
          yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar25->exts,(ly_bool *)0x0);
          plVar10 = plVar25->exts;
          ypr_substmt(pctx,LY_STMT_UNITS,'\0',*(char **)(plVar25 + 1),'\0',plVar10);
          lVar21 = 0;
          plVar24 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar2 = plVar25[1].next;
            if (plVar2 == (lysp_deviate *)0x0) {
              plVar9 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar9 = plVar2[-1].exts;
            }
            if (plVar9 <= plVar24) break;
            yprp_restr(pctx,(lysp_restr *)(&plVar2->mod + lVar21),LY_STMT_MUST,(ly_bool *)0x0);
            plVar24 = (lysp_ext_instance *)((long)&plVar24->name + 1);
            lVar21 = lVar21 + 0x40;
          }
          lVar21 = 0x10;
          plVar24 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar9 = plVar25[1].exts;
            if (plVar9 == (lysp_ext_instance *)0x0) {
              plVar18 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar18 = plVar9[-1].exts;
            }
            if (plVar18 <= plVar24) break;
            plVar10 = plVar25->exts;
            ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar24,
                        *(char **)((long)plVar9 + lVar21 + -0x10),
                        *(byte *)((long)&plVar9->name + lVar21 + 1) & 1,plVar10);
            plVar24 = (lysp_ext_instance *)((long)&plVar24->name + 1);
            lVar21 = lVar21 + 0x18;
          }
          lVar21 = 0x10;
          uVar23 = 0;
          while( true ) {
            lVar3 = *(long *)(plVar25 + 2);
            if (lVar3 == 0) {
              uVar17 = 0;
            }
            else {
              uVar17 = *(ulong *)(lVar3 + -8);
            }
            if (uVar17 <= uVar23) break;
            plVar10 = plVar25->exts;
            ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar23,*(char **)(lVar3 + -0x10 + lVar21),
                        *(byte *)(lVar3 + 1 + lVar21) & 1,plVar10);
            uVar23 = uVar23 + 1;
            lVar21 = lVar21 + 0x18;
          }
          ypr_config(pctx,*(uint16_t *)&plVar25[2].next,plVar25->exts,(ly_bool *)0x0);
          ypr_mandatory(pctx,*(uint16_t *)&plVar25[2].next,plVar25->exts,(ly_bool *)0x0);
          uVar7 = *(uint *)&plVar25[2].next;
          if ((uVar7 >> 9 & 1) != 0) {
            ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)plVar25->exts,
                         (void *)(ulong)*(uint *)((long)&plVar25[2].next + 4),0,(ly_bool *)plVar10);
            uVar7 = (uint)*(ushort *)&plVar25[2].next;
          }
          if ((uVar7 >> 10 & 1) != 0) {
            uVar7 = *(uint *)&plVar25[2].exts;
LAB_0018b945:
            plVar10 = plVar25->exts;
            if ((void *)(ulong)uVar7 == (void *)0x0) {
              ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",'\0',plVar10);
            }
            else {
              ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar10,(void *)(ulong)uVar7,0,
                           (ly_bool *)plVar10);
            }
          }
          break;
        case '\x03':
          ly_print_((pctx->field_0).field_0.out,"delete {\n");
          puVar19 = &(pctx->field_0).field_0.level;
          *puVar19 = *puVar19 + 1;
          yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar25->exts,(ly_bool *)0x0);
          ypr_substmt(pctx,LY_STMT_UNITS,'\0',*(char **)(plVar25 + 1),'\0',plVar25->exts);
          lVar21 = 0;
          plVar10 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar2 = plVar25[1].next;
            if (plVar2 == (lysp_deviate *)0x0) {
              plVar24 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar24 = plVar2[-1].exts;
            }
            if (plVar24 <= plVar10) break;
            yprp_restr(pctx,(lysp_restr *)(&plVar2->mod + lVar21),LY_STMT_MUST,(ly_bool *)0x0);
            plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
            lVar21 = lVar21 + 0x40;
          }
          lVar21 = 0x10;
          plVar10 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar24 = plVar25[1].exts;
            if (plVar24 == (lysp_ext_instance *)0x0) {
              plVar9 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar9 = plVar24[-1].exts;
            }
            if (plVar9 <= plVar10) break;
            ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar10,
                        *(char **)((long)plVar24 + lVar21 + -0x10),
                        *(byte *)((long)&plVar24->name + lVar21 + 1) & 1,plVar25->exts);
            plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
            lVar21 = lVar21 + 0x18;
          }
          lVar21 = 0x10;
          uVar23 = 0;
          while( true ) {
            lVar3 = *(long *)(plVar25 + 2);
            if (lVar3 == 0) {
              uVar17 = 0;
            }
            else {
              uVar17 = *(ulong *)(lVar3 + -8);
            }
            if (uVar17 <= uVar23) break;
            ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar23,*(char **)(lVar3 + -0x10 + lVar21),
                        *(byte *)(lVar3 + 1 + lVar21) & 1,plVar25->exts);
            uVar23 = uVar23 + 1;
            lVar21 = lVar21 + 0x18;
          }
          break;
        case '\x04':
          ly_print_((pctx->field_0).field_0.out,"replace {\n");
          puVar19 = &(pctx->field_0).field_0.level;
          *puVar19 = *puVar19 + 1;
          yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar25->exts,(ly_bool *)0x0);
          if (*(lysp_type **)(plVar25 + 1) != (lysp_type *)0x0) {
            yprp_type(pctx,*(lysp_type **)(plVar25 + 1));
          }
          ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)plVar25[1].next,'\0',plVar25->exts);
          plVar10 = plVar25->exts;
          ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)plVar25[1].exts,
                      *(byte *)((long)&plVar25[2].next + 1) & 1,plVar10);
          ypr_config(pctx,*(uint16_t *)&plVar25[2].exts,plVar25->exts,(ly_bool *)0x0);
          ypr_mandatory(pctx,*(uint16_t *)&plVar25[2].exts,plVar25->exts,(ly_bool *)0x0);
          uVar7 = *(uint *)&plVar25[2].exts;
          if ((uVar7 >> 9 & 1) != 0) {
            ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)plVar25->exts,
                         (void *)(ulong)*(uint *)((long)&plVar25[2].exts + 4),0,(ly_bool *)plVar10);
            uVar7 = (uint)*(ushort *)&plVar25[2].exts;
          }
          if ((uVar7 >> 10 & 1) != 0) {
            uVar7 = *(uint *)(plVar25 + 3);
            goto LAB_0018b945;
          }
        }
        uVar7 = *(int *)((long)&pctx->field_0 + 8) - 1;
        (pctx->field_0).field_0.level = (uint16_t)uVar7;
        uVar7 = (uVar7 & 0xffff) * 2;
        if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
            (undefined1  [24])0x0) {
          uVar7 = 0;
        }
        ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar7,"");
LAB_0018b9a2:
      }
      uVar7 = *(int *)((long)&pctx->field_0 + 8) - 1;
      (pctx->field_0).field_0.level = (uint16_t)uVar7;
      uVar7 = (uVar7 & 0xffff) * 2;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
          (undefined1  [24])0x0) {
        uVar7 = 0;
      }
      ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar7,"");
      plVar10 = (lysp_ext_instance *)((long)&local_38->name + 1);
      plVar15 = local_48->deviations;
    } while (plVar15 != (lysp_deviation *)0x0);
  }
  return;
}

Assistant:

static void
yang_print_parsed_body(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *grp;
    struct lysp_node_augment *aug;

    LY_ARRAY_FOR(modp->extensions, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension(pctx, &modp->extensions[u]);
    }

    YPR_EXTRA_LINE(modp->extensions, pctx);

    if (yprp_extension_has_printable_instances(modp->exts)) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension_instances(pctx, LY_STMT_MODULE, 0, modp->exts, NULL);
    }

    YPR_EXTRA_LINE(modp->exts, pctx);

    LY_ARRAY_FOR(modp->features, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_feature(pctx, &modp->features[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->features, pctx);

    LY_ARRAY_FOR(modp->identities, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_identity(pctx, &modp->identities[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->identities, pctx);

    LY_ARRAY_FOR(modp->typedefs, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_typedef(pctx, &modp->typedefs[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->typedefs, pctx);

    LY_LIST_FOR(modp->groupings, grp) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_grouping(pctx, grp);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->groupings, pctx);

    LY_LIST_FOR(modp->data, data) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_node(pctx, data);
    }

    YPR_EXTRA_LINE(modp->data, pctx);

    LY_LIST_FOR(modp->augments, aug) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_augment(pctx, aug);
    }

    YPR_EXTRA_LINE(modp->augments, pctx);

    LY_LIST_FOR(modp->rpcs, action) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_action(pctx, action);
    }

    YPR_EXTRA_LINE(modp->rpcs, pctx);

    LY_LIST_FOR(modp->notifs, notif) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_notification(pctx, notif);
    }

    YPR_EXTRA_LINE(modp->notifs, pctx);

    LY_ARRAY_FOR(modp->deviations, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_deviation(pctx, &modp->deviations[u]);
    }

    YPR_EXTRA_LINE(modp->deviations, pctx);
}